

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

ButtonRole __thiscall QDialogButtonBox::buttonRole(QDialogButtonBox *this,QAbstractButton *button)

{
  long lVar1;
  QDialogButtonBoxPrivate *pQVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  QAbstractButton *in_RSI;
  long in_FS_OFFSET;
  int j;
  QList<QAbstractButton_*> *list;
  int i;
  QDialogButtonBoxPrivate *d;
  qsizetype in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ButtonRole *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  QList<QAbstractButton_*> *in_stack_ffffffffffffffc8;
  ButtonRole local_2c;
  ButtonRole local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDialogButtonBox *)0x66d94a);
  local_2c = AcceptRole;
  do {
    if (ApplyRole < local_2c) {
      local_18 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                 ::value((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                          *)in_stack_ffffffffffffffc8,
                         (QAbstractButton **)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
LAB_0066da21:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_18;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffffc8 = pQVar2->buttonLists + local_2c;
    in_stack_ffffffffffffffc4 = 0;
    while( true ) {
      in_stack_ffffffffffffffb8 = (ButtonRole *)(long)in_stack_ffffffffffffffc4;
      qVar3 = QList<QAbstractButton_*>::size(in_stack_ffffffffffffffc8);
      if (qVar3 <= (long)in_stack_ffffffffffffffb8) break;
      ppQVar4 = QList<QAbstractButton_*>::at
                          ((QList<QAbstractButton_*> *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8);
      if (*ppQVar4 == in_RSI) {
        local_18 = local_2c;
        goto LAB_0066da21;
      }
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1;
    }
    local_2c = local_2c + RejectRole;
  } while( true );
}

Assistant:

QDialogButtonBox::ButtonRole QDialogButtonBox::buttonRole(QAbstractButton *button) const
{
    Q_D(const QDialogButtonBox);
    for (int i = 0; i < NRoles; ++i) {
        const QList<QAbstractButton *> &list = d->buttonLists[i];
        for (int j = 0; j < list.size(); ++j) {
            if (list.at(j) == button)
                return ButtonRole(i);
        }
    }
    return d->hiddenButtons.value(button, InvalidRole);
}